

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

void __thiscall
Js::LineOffsetCache::BuildCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *ptr;
  undefined1 local_78 [8];
  TrackAllocData data;
  LPCUTF8 sourceStartCharacter_local;
  charcount_t local_38;
  charcount_t local_34;
  charcount_t startingCharacterOffset_local;
  charcount_t startingByteOffset_local;
  
  data._32_8_ = sourceStartCharacter;
  local_38 = startingCharacterOffset;
  local_34 = startingByteOffset;
  if (sourceStartCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,199,"(sourceStartCharacter)",
                                "The source start character passed in is null.");
    if (!bVar2) goto LAB_006e6501;
    *puVar3 = 0;
  }
  if (sourceEndCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,200,"(sourceEndCharacter)",
                                "The source end character passed in is null.");
    if (!bVar2) goto LAB_006e6501;
    *puVar3 = 0;
  }
  if (sourceEndCharacter < sourceStartCharacter) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xc9,"(sourceStartCharacter <= sourceEndCharacter)",
                                "The source start character should not be beyond the source end character."
                               );
    if (!bVar2) goto LAB_006e6501;
    *puVar3 = 0;
  }
  if ((this->lineCharacterOffsetCacheList).ptr !=
      (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xca,"(!this->lineCharacterOffsetCacheList)",
                                "The cache is already built.");
    if (!bVar2) {
LAB_006e6501:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_78 = (undefined1  [8])
             &JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2b6b984;
  data.filename._0_4_ = 0xcc;
  alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_78);
  ptr = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
        new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  ptr->alloc = allocator;
  ptr->_vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377ee8;
  (ptr->buffer).ptr = (uint *)0x0;
  ptr->count = 0;
  ptr[1]._vptr_ReadOnlyList = (_func_int **)0x400000000;
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierSet(&this->lineCharacterOffsetCacheList,ptr);
  AddLine(this,allocator,startingCharacterOffset,startingByteOffset);
  while( true ) {
    bVar2 = FindNextLine((LPCUTF8 *)&data.line,sourceEndCharacter,&local_38,&local_34,0xffffffff);
    if (!bVar2) break;
    AddLine(this,allocator,local_38,local_34);
  }
  return;
}

Assistant:

void LineOffsetCache::BuildCache(Recycler * allocator, _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset)
    {
        AssertMsg(sourceStartCharacter, "The source start character passed in is null.");
        AssertMsg(sourceEndCharacter, "The source end character passed in is null.");
        AssertMsg(sourceStartCharacter <= sourceEndCharacter, "The source start character should not be beyond the source end character.");
        AssertMsg(!this->lineCharacterOffsetCacheList, "The cache is already built.");

        this->lineCharacterOffsetCacheList = RecyclerNew(allocator, LineOffsetCacheList, allocator);

        // Add the first line in the cache list.
        this->AddLine(allocator, startingCharacterOffset, startingByteOffset);

        while (FindNextLine(sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset))
        {
            this->AddLine(allocator, startingCharacterOffset, startingByteOffset);
        }

    }